

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_writer.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileTableDataWriter::FinalizeTable
          (SingleFileTableDataWriter *this,TableStatistics *global_stats,DataTableInfo *info,
          Serializer *serializer)

{
  MetadataWriter *pMVar1;
  RowGroupPointer *pRVar2;
  Serializer *this_00;
  size_t sVar3;
  ulong uVar4;
  RowGroupPointer *pointer_00;
  ulong uVar5;
  bool v1_0_0_storage;
  SingleFileTableDataWriter *local_b68;
  SerializationOptions *local_b60;
  idx_t total_rows;
  DataTableInfo *local_b50;
  Serializer *local_b48;
  MetaBlockPointer pointer;
  vector<duckdb::IndexStorageInfo,_true> index_storage_infos;
  vector<duckdb::BlockPointer,_true> compat_block_pointers;
  undefined1 local_b00 [56];
  undefined1 local_ac8 [56];
  case_insensitive_map_t<Value> options;
  BinarySerializer stats_serializer;
  
  local_b50 = info;
  pointer = MetadataWriter::GetMetaBlockPointer(this->table_data_writer);
  pMVar1 = this->table_data_writer;
  local_b60 = &serializer->options;
  local_b68 = this;
  SerializationOptions::SerializationOptions((SerializationOptions *)local_ac8,local_b60);
  BinarySerializer::BinarySerializer
            (&stats_serializer,&pMVar1->super_WriteStream,(SerializationOptions *)local_ac8);
  local_b48 = serializer;
  ::std::__cxx11::string::~string((string *)(local_ac8 + 8));
  BinarySerializer::OnObjectBegin(&stats_serializer);
  TableStatistics::Serialize(global_stats,&stats_serializer.super_Serializer);
  BinarySerializer::OnObjectEnd(&stats_serializer);
  options._M_h._M_buckets =
       (__buckets_ptr)
       ((long)(local_b68->super_TableDataWriter).row_group_pointers.
              super_vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
              super__Vector_base<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(local_b68->super_TableDataWriter).row_group_pointers.
              super_vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
              super__Vector_base<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
              _M_impl.super__Vector_impl_data._M_start >> 6);
  (**(local_b68->table_data_writer->super_WriteStream)._vptr_WriteStream)
            (local_b68->table_data_writer,&options,8);
  total_rows = 0;
  pRVar2 = (local_b68->super_TableDataWriter).row_group_pointers.
           super_vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
           super__Vector_base<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = 0;
  for (pointer_00 = (local_b68->super_TableDataWriter).row_group_pointers.
                    super_vector<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>.
                    super__Vector_base<duckdb::RowGroupPointer,_std::allocator<duckdb::RowGroupPointer>_>
                    ._M_impl.super__Vector_impl_data._M_start; this_00 = local_b48,
      pointer_00 != pRVar2; pointer_00 = pointer_00 + 1) {
    uVar4 = pointer_00->tuple_count + pointer_00->row_start;
    if (uVar5 < uVar4) {
      uVar5 = uVar4;
      total_rows = uVar4;
    }
    pMVar1 = local_b68->table_data_writer;
    SerializationOptions::SerializationOptions((SerializationOptions *)local_b00,local_b60);
    BinarySerializer::BinarySerializer
              ((BinarySerializer *)&options,&pMVar1->super_WriteStream,
               (SerializationOptions *)local_b00);
    ::std::__cxx11::string::~string((string *)(local_b00 + 8));
    BinarySerializer::OnObjectBegin((BinarySerializer *)&options);
    RowGroup::Serialize(pointer_00,(Serializer *)&options);
    BinarySerializer::OnObjectEnd((BinarySerializer *)&options);
    BinarySerializer::~BinarySerializer((BinarySerializer *)&options);
  }
  Serializer::WriteProperty<duckdb::MetaBlockPointer>(local_b48,0x65,"table_pointer",&pointer);
  Serializer::WriteProperty<unsigned_long>(this_00,0x66,"total_rows",&total_rows);
  SerializationOptions::SerializationOptions((SerializationOptions *)&options,local_b60);
  sVar3 = options._M_h._M_rehash_policy._M_next_resize;
  ::std::__cxx11::string::~string((string *)&options._M_h._M_bucket_count);
  options._M_h._M_buckets = &options._M_h._M_single_bucket;
  options._M_h._M_bucket_count = 1;
  options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  options._M_h._M_element_count = 0;
  options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  options._M_h._M_rehash_policy._M_next_resize = 0;
  options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  v1_0_0_storage = sVar3 < 3;
  if (!v1_0_0_storage) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[15],bool&>
              (&options,(_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)"v1_0_0_storage",&v1_0_0_storage);
  }
  TableIndexList::GetStorageInfos(&index_storage_infos,&local_b50->indexes,&options);
  compat_block_pointers.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  compat_block_pointers.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  compat_block_pointers.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Serializer::WriteProperty<duckdb::vector<duckdb::BlockPointer,true>>
            (this_00,0x67,"index_pointers",&compat_block_pointers);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::IndexStorageInfo,true>>
            (this_00,0x68,"index_storage_infos",&index_storage_infos);
  ::std::_Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>::~_Vector_base
            ((_Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_> *)
             &compat_block_pointers);
  ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::~vector
            (&index_storage_infos.
              super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&options._M_h);
  BinarySerializer::~BinarySerializer(&stats_serializer);
  return;
}

Assistant:

void SingleFileTableDataWriter::FinalizeTable(const TableStatistics &global_stats, DataTableInfo *info,
                                              Serializer &serializer) {

	// store the current position in the metadata writer
	// this is where the row groups for this table start
	auto pointer = table_data_writer.GetMetaBlockPointer();

	// Serialize statistics as a single unit
	BinarySerializer stats_serializer(table_data_writer, serializer.GetOptions());
	stats_serializer.Begin();
	global_stats.Serialize(stats_serializer);
	stats_serializer.End();

	// now start writing the row group pointers to disk
	table_data_writer.Write<uint64_t>(row_group_pointers.size());
	idx_t total_rows = 0;
	for (auto &row_group_pointer : row_group_pointers) {
		auto row_group_count = row_group_pointer.row_start + row_group_pointer.tuple_count;
		if (row_group_count > total_rows) {
			total_rows = row_group_count;
		}

		// Each RowGroup is its own unit
		BinarySerializer row_group_serializer(table_data_writer, serializer.GetOptions());
		row_group_serializer.Begin();
		RowGroup::Serialize(row_group_pointer, row_group_serializer);
		row_group_serializer.End();
	}

	// Now begin the metadata as a unit
	// Pointer to the table itself goes to the metadata stream.
	serializer.WriteProperty(101, "table_pointer", pointer);
	serializer.WriteProperty(102, "total_rows", total_rows);

	auto v1_0_0_storage = serializer.GetOptions().serialization_compatibility.serialization_version < 3;
	case_insensitive_map_t<Value> options;
	if (!v1_0_0_storage) {
		options.emplace("v1_0_0_storage", v1_0_0_storage);
	}
	auto index_storage_infos = info->GetIndexes().GetStorageInfos(options);

#ifdef DUCKDB_BLOCK_VERIFICATION
	for (auto &entry : index_storage_infos) {
		for (auto &allocator : entry.allocator_infos) {
			for (auto &block : allocator.block_pointers) {
				checkpoint_manager.verify_block_usage_count[block.block_id]++;
			}
		}
	}
#endif

	// write empty block pointers for forwards compatibility
	vector<BlockPointer> compat_block_pointers;
	serializer.WriteProperty(103, "index_pointers", compat_block_pointers);
	serializer.WritePropertyWithDefault(104, "index_storage_infos", index_storage_infos);
}